

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_glow.cpp
# Opt level: O0

void gl_InitGlow(FScanner *sc)

{
  bool bVar1;
  FTextureID FVar2;
  uint32 uVar3;
  FTexture *pFVar4;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_48;
  int local_44;
  PalEntry color;
  FTexture *tex_2;
  FTextureID flump_2;
  FTexture *tex_1;
  FTextureID flump_1;
  FTexture *tex;
  FTextureID flump;
  FScanner *sc_local;
  
  FScanner::MustGetStringName(sc,"{");
  do {
    do {
      while( true ) {
        while( true ) {
          bVar1 = FScanner::CheckString(sc,"}");
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            return;
          }
          FScanner::MustGetString(sc);
          bVar1 = FScanner::Compare(sc,"FLATS");
          if (!bVar1) break;
          FScanner::MustGetStringName(sc,"{");
          while (bVar1 = FScanner::CheckString(sc,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
            FScanner::MustGetString(sc);
            FVar2 = FTextureManager::CheckForTexture(&TexMan,sc->String,2,1);
            pFVar4 = FTextureManager::operator[](&TexMan,FVar2);
            if (pFVar4 != (FTexture *)0x0) {
              *(ushort *)&(pFVar4->gl_info).field_0x4c =
                   *(ushort *)&(pFVar4->gl_info).field_0x4c & 0xfff7 | 8;
              *(ushort *)&(pFVar4->gl_info).field_0x4c =
                   *(ushort *)&(pFVar4->gl_info).field_0x4c & 0xfffb | 4;
            }
          }
        }
        bVar1 = FScanner::Compare(sc,"WALLS");
        if (!bVar1) break;
        FScanner::MustGetStringName(sc,"{");
        while (bVar1 = FScanner::CheckString(sc,"}"), ((bVar1 ^ 0xffU) & 1) != 0) {
          FScanner::MustGetString(sc);
          FVar2 = FTextureManager::CheckForTexture(&TexMan,sc->String,1,1);
          pFVar4 = FTextureManager::operator[](&TexMan,FVar2);
          if (pFVar4 != (FTexture *)0x0) {
            *(ushort *)&(pFVar4->gl_info).field_0x4c =
                 *(ushort *)&(pFVar4->gl_info).field_0x4c & 0xfff7 | 8;
            *(ushort *)&(pFVar4->gl_info).field_0x4c =
                 *(ushort *)&(pFVar4->gl_info).field_0x4c & 0xfffb | 4;
          }
        }
      }
      bVar1 = FScanner::Compare(sc,"TEXTURE");
    } while (!bVar1);
    FScanner::SetCMode(sc,true);
    FScanner::MustGetString(sc);
    local_44 = (int)FTextureManager::CheckForTexture(&TexMan,sc->String,2,1);
    _color = FTextureManager::operator[](&TexMan,(FTextureID)local_44);
    FScanner::MustGetStringName(sc,",");
    FScanner::MustGetString(sc);
    uVar3 = V_GetColor((DWORD *)0x0,sc->String);
    PalEntry::PalEntry((PalEntry *)&local_48.field_0,uVar3);
    bVar1 = FScanner::CheckString(sc,",");
    if (bVar1) {
      bVar1 = FScanner::CheckNumber(sc);
      if (bVar1) {
        if (_color != (FTexture *)0x0) {
          (_color->gl_info).GlowHeight = sc->Number;
        }
        bVar1 = FScanner::CheckString(sc,",");
        if (!bVar1) goto LAB_005351d4;
      }
      FScanner::MustGetStringName(sc,"fullbright");
      if (_color != (FTexture *)0x0) {
        *(ushort *)&(_color->gl_info).field_0x4c =
             *(ushort *)&(_color->gl_info).field_0x4c & 0xfff7 | 8;
      }
    }
LAB_005351d4:
    FScanner::SetCMode(sc,false);
    if ((_color != (FTexture *)0x0) &&
       (uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&local_48.field_0), uVar3 != 0))
    {
      *(ushort *)&(_color->gl_info).field_0x4c =
           *(ushort *)&(_color->gl_info).field_0x4c & 0xfffb | 4;
      (_color->gl_info).GlowColor.field_0 = local_48;
    }
  } while( true );
}

Assistant:

void gl_InitGlow(FScanner &sc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("FLATS"))
		{
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Flat,FTextureManager::TEXMAN_TryAny);
				FTexture *tex = TexMan[flump];
				if (tex) tex->gl_info.bGlowing = tex->gl_info.bFullbright = true;
			}
		}
		else if (sc.Compare("WALLS"))
		{
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Wall,FTextureManager::TEXMAN_TryAny);
				FTexture *tex = TexMan[flump];
				if (tex) tex->gl_info.bGlowing = tex->gl_info.bFullbright = true;
			}
		}
		else if (sc.Compare("TEXTURE"))
		{
			sc.SetCMode(true);
			sc.MustGetString();
			FTextureID flump=TexMan.CheckForTexture(sc.String, FTexture::TEX_Flat,FTextureManager::TEXMAN_TryAny);
			FTexture *tex = TexMan[flump];
			sc.MustGetStringName(",");
			sc.MustGetString();
			PalEntry color = V_GetColor(NULL, sc.String);
			//sc.MustGetStringName(",");
			//sc.MustGetNumber();
			if (sc.CheckString(","))
			{
				if (sc.CheckNumber())
				{
					if (tex) tex->gl_info.GlowHeight = sc.Number;
					if (!sc.CheckString(",")) goto skip_fb;
				}

				sc.MustGetStringName("fullbright");
				if (tex) tex->gl_info.bFullbright = true;
			}
		skip_fb:
			sc.SetCMode(false);

			if (tex && color != 0)
			{
				tex->gl_info.bGlowing = true;
				tex->gl_info.GlowColor = color;
			}
		}
	}
}